

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

SerialArena * __thiscall
google::protobuf::internal::SerialArena::New(SerialArena *this,Memory mem,void *owner)

{
  LogMessage *other;
  SerialArena *this_00;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((Block *)mem.ptr < (Block *)0x50) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0x74);
    other = LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: (kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize) <= (mem.size): "
                      );
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  this->owner_ = (void *)0x0;
  this->head_ = (Block *)mem.ptr;
  this->next_ = (SerialArena *)0x0;
  this_00 = (SerialArena *)Block::Pointer((Block *)this,0x18);
  SerialArena(this_00,(Block *)this,(void *)mem.size);
  return this_00;
}

Assistant:

SerialArena* SerialArena::New(Memory mem, void* owner) {
  GOOGLE_DCHECK_LE(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize, mem.size);

  auto b = new (mem.ptr) Block{nullptr, mem.size};
  return new (b->Pointer(kBlockHeaderSize)) SerialArena(b, owner);
}